

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDeep.c
# Opt level: O2

Gia_Man_t * Gia_ManDeepSynOne(int nNoImpr,int TimeOut,int nAnds,int Seed,int fUseTwo,int fVerbose)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Abc_Frame_t *pAVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p;
  abctime aVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  char *__s;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  char Command [1000];
  
  if (TimeOut == 0) {
    lVar9 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    lVar9 = (long)TimeOut * 1000000 + aVar3;
  }
  aVar3 = Abc_Clock();
  pAVar4 = Abc_FrameGetGlobalFrame();
  pGVar5 = Abc_FrameReadGia(pAVar4);
  pGVar5 = Gia_ManDup(pGVar5);
  Abc_Random(1);
  iVar10 = -10;
  if (-10 < Seed) {
    iVar10 = Seed;
  }
  iVar10 = iVar10 + 10;
  while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
    Abc_Random(0);
  }
  uVar14 = 0xffffffff;
  uVar13 = 0;
  while( true ) {
    if (uVar13 == 100000) {
      aVar6 = Abc_Clock();
      printf("Iteration limit (%d iters) is reached after %.2f seconds.\n",
             (double)((float)(aVar6 - aVar3) / 1e+06),100000);
      return pGVar5;
    }
    uVar1 = Abc_Random(0);
    if (fUseTwo == 0) {
      uVar7 = (uVar13 & 3) + 3;
    }
    else {
      uVar7 = (uVar13 / 5) * -5 + 2 + uVar13;
    }
    pcVar12 = "; &put; compress2rs; &get";
    if ((uVar1 & 2) == 0) {
      pcVar12 = "; &dc2";
    }
    pcVar8 = " -f";
    if ((uVar1 & 1) == 0) {
      pcVar8 = "";
    }
    pcVar11 = "; &fx";
    if ((uVar1 & 4) == 0) {
      pcVar11 = "";
    }
    __s = Command;
    sprintf(__s,"&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",pcVar8,(ulong)uVar7,pcVar11,pcVar12)
    ;
    pAVar4 = Abc_FrameGetGlobalFrame();
    iVar10 = Cmd_CommandExecute(pAVar4,__s);
    if (iVar10 != 0) {
      Abc_Print((int)pAVar4,__s,Command);
      return (Gia_Man_t *)0x0;
    }
    pAVar4 = Abc_FrameGetGlobalFrame();
    p = Abc_FrameReadGia(pAVar4);
    iVar10 = Gia_ManAndNum(pGVar5);
    iVar2 = Gia_ManAndNum(p);
    if (iVar2 < iVar10) {
      Gia_ManStop(pGVar5);
      pGVar5 = Gia_ManDup(p);
      uVar14 = uVar13;
      if (fVerbose != 0) {
        printf("Iter %6d : ",(ulong)uVar13);
        aVar6 = Abc_Clock();
        printf("Time %8.2f sec : ",(double)((float)(aVar6 - aVar3) / 1e+06));
        uVar1 = Gia_ManAndNum(pGVar5);
        printf("And = %6d  ",(ulong)uVar1);
        uVar1 = Gia_ManLevelNum(pGVar5);
        printf("Lev = %3d  ",(ulong)uVar1);
        printf("<== best : ");
        printf("%s",Command);
        putchar(10);
      }
    }
    if ((lVar9 != 0) && (aVar6 = Abc_Clock(), lVar9 < aVar6)) break;
    if (nNoImpr < (int)(uVar13 - uVar14)) {
      aVar6 = Abc_Clock();
      printf("Completed %d iterations without improvement in %.2f seconds.\n",
             (double)((float)(aVar6 - aVar3) / 1e+06),(ulong)(uint)nNoImpr);
      goto LAB_005c4e9b;
    }
    uVar13 = uVar13 + 1;
  }
  printf("Runtime limit (%d sec) is reached after %d iterations.\n",(ulong)(uint)TimeOut,
         (ulong)uVar13);
LAB_005c4e9b:
  if (nAnds < -1 || nAnds == 0) {
    return pGVar5;
  }
  aVar6 = Abc_Clock();
  printf("Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n",
         (double)((float)(aVar6 - aVar3) / 1e+06),0xffffffffffffffff,(ulong)(uint)nAnds,
         (ulong)uVar13);
  return pGVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDeepSynOne( int nNoImpr, int TimeOut, int nAnds, int Seed, int fUseTwo, int fVerbose )
{
    abctime nTimeToStop = TimeOut ? Abc_Clock() + TimeOut * CLOCKS_PER_SEC : 0;
    abctime clkStart    = Abc_Clock();
    int s, i, IterMax   = 100000, nAndsMin = -1, iIterLast = -1;
    Gia_Man_t * pTemp   = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
    Gia_Man_t * pNew    = Gia_ManDup( pTemp );
    Abc_Random(1);
    for ( s = 0; s < 10+Seed; s++ )
        Abc_Random(0);
    for ( i = 0; i < IterMax; i++ )
    {
        unsigned Rand = Abc_Random(0);
        int fDch = Rand & 1;
        //int fCom = (Rand >> 1) & 3;
        int fCom = (Rand >> 1) & 1;
        int fFx  = (Rand >> 2) & 1;
        int KLut = fUseTwo ? 2 + (i % 5) : 3 + (i % 4);
        int fChange = 0;
        char Command[1000];
        char * pComp = NULL;
        if ( fCom == 3 )
            pComp = "; &put; compress2rs; compress2rs; compress2rs; &get";
        else if ( fCom == 2 )
            pComp = "; &put; compress2rs; compress2rs; &get";
        else if ( fCom == 1 )
            pComp = "; &put; compress2rs; &get";
        else if ( fCom == 0 )
            pComp = "; &dc2";
        sprintf( Command, "&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",
            fDch ? " -f" : "", KLut, fFx ? "; &fx" : "", pComp );
        if ( Cmd_CommandExecute(Abc_FrameGetGlobalFrame(), Command) )
        {
            Abc_Print( 1, "Something did not work out with the command \"%s\".\n", Command );
            return NULL;
        }
        pTemp = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
        if ( Gia_ManAndNum(pNew) > Gia_ManAndNum(pTemp) )
        {
            Gia_ManStop( pNew );
            pNew = Gia_ManDup( pTemp );
            fChange = 1;
            iIterLast = i;
        }
        else if ( Gia_ManAndNum(pNew) + Gia_ManAndNum(pNew)/10 < Gia_ManAndNum(pTemp) ) 
        {
            //printf( "Updating\n" );
            //Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), Gia_ManDup(pNew) );
        }
        if ( fChange && fVerbose )
        {
            printf( "Iter %6d : ", i );
            printf( "Time %8.2f sec : ", (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            printf( "And = %6d  ", Gia_ManAndNum(pNew) );
            printf( "Lev = %3d  ", Gia_ManLevelNum(pNew) );
            if ( fChange ) 
                printf( "<== best : " );
            else if ( fVerbose )
                printf( "           " );
            printf( "%s", Command );
            printf( "\n" );
        }
        if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        {
            printf( "Runtime limit (%d sec) is reached after %d iterations.\n", TimeOut, i );
            break;
        }
        if ( i - iIterLast > nNoImpr )
        {
            printf( "Completed %d iterations without improvement in %.2f seconds.\n", 
                nNoImpr, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            break;
        }
    }
    if ( i == IterMax )
        printf( "Iteration limit (%d iters) is reached after %.2f seconds.\n", IterMax, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    else if ( nAnds && nAndsMin <= nAnds )
        printf( "Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n", 
            nAndsMin, nAnds, i, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    return pNew;
}